

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTable::isSelected(QAccessibleTable *this,QAccessibleInterface *childCell)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long *plVar3;
  long in_FS_OFFSET;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (childCell == (QAccessibleInterface *)0x0) {
LAB_004da82b:
    QMessageLogger::warning();
    QDebug::operator<<(&local_20,
                       "QAccessibleTable::isSelected: Accessible interface must be a direct child of the table interface."
                      );
    QDebug::~QDebug(&local_20);
  }
  else {
    puVar2 = (undefined1 *)(**(code **)(*(long *)childCell + 0x40))(childCell);
    if ((QAccessibleObject *)puVar2 != &this->super_QAccessibleObject) goto LAB_004da82b;
    plVar3 = (long *)(**(code **)(*(long *)childCell + 0xa0))(childCell,6);
    if (plVar3 != (long *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        uVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
        return (bool)uVar1;
      }
      goto LAB_004da88a;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
LAB_004da88a:
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTable::isSelected(QAccessibleInterface *childCell) const
{
    if (!childCell || childCell->parent() != this) {
        qWarning() << "QAccessibleTable::isSelected: Accessible interface must be a direct child of the table interface.";
        return false;
    }

    const QAccessibleTableCellInterface *cell = childCell->tableCellInterface();
    if (cell)
        return cell->isSelected();

    return false;
}